

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_tree_renderer.cpp
# Opt level: O3

string * __thiscall
duckdb::CreateTreeRecursive_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,RenderTree *root,idx_t x,idx_t y)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pCVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **__dest;
  pointer ppVar5;
  string *psVar6;
  pointer params;
  pointer ppVar7;
  undefined8 uVar8;
  pointer pCVar9;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  size_type __dnew;
  optional_ptr<duckdb::RenderTreeNode,_true> node_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  items;
  string grid_item_format;
  string content;
  string title;
  string local_220;
  string local_200;
  optional_ptr<duckdb::RenderTreeNode,_true> local_1e0;
  RenderTree *local_1d8;
  pointer local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined8 local_178;
  idx_t local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150 [2];
  pointer *local_140;
  pointer local_138;
  pointer local_130 [2];
  undefined1 *local_120;
  long local_118;
  undefined1 local_110 [16];
  RenderTree *local_100;
  pointer local_f8;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1d8 = (RenderTree *)this;
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_168._8_8_ = local_150;
  local_200._M_dataplus._M_p = (pointer)0x5a;
  __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)::std::__cxx11::string::_M_create
                         ((ulong *)(local_168._M_local_buf + 8),(ulong)&local_200);
  _Var4._M_p = local_200._M_dataplus._M_p;
  local_150[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_200._M_dataplus._M_p;
  local_168._8_8_ = __dest;
  switchD_00b041bd::default
            (__dest,
             "\n        <div class=\"tf-nc\">\n            <div class=\"title\">%s</div>%s\n        </div>\n    "
             ,0x5a);
  local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var4._M_p;
  *(char *)((long)__dest + (long)_Var4._M_p) = '\0';
  local_1e0 = RenderTree::GetNode(local_1d8,(idx_t)root,x);
  if (local_1e0.ptr == (RenderTreeNode *)0x0) {
    local_90._M_allocated_capacity = (size_type)&local_80;
    local_90._8_8_ = 0;
    local_80._M_local_buf[0] = '\0';
  }
  else {
    optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&local_1e0);
    local_f0 = local_e0;
    pcVar2 = ((local_1e0.ptr)->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + ((local_1e0.ptr)->name)._M_string_length);
    optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&local_1e0);
    uVar8 = local_1e0.ptr;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_220._M_dataplus._M_p = (pointer)0x3d;
    local_200._M_dataplus._M_p =
         (pointer)::std::__cxx11::string::_M_create((ulong *)&local_200,(ulong)&local_220);
    local_200.field_2._M_allocated_capacity = (size_type)local_220._M_dataplus._M_p;
    builtin_strncpy(local_200._M_dataplus._M_p,
                    "\n            <div class=\"content\">\n%s\n            </div>\n    ",0x3d);
    local_200._M_string_length = (size_type)local_220._M_dataplus._M_p;
    local_200._M_dataplus._M_p[(long)local_220._M_dataplus._M_p] = '\0';
    local_188._M_allocated_capacity = 0;
    local_188._8_8_ = 0;
    local_178 = 0;
    ppVar5 = (((RenderTreeNode *)uVar8)->extra_text).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    params = (((RenderTreeNode *)uVar8)->extra_text).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_100 = root;
    local_f8 = params;
    if (ppVar5 == params) {
      local_120 = local_110;
      local_118 = 0;
      local_110[0] = 0;
    }
    else {
      local_168._M_allocated_capacity = uVar8;
      local_170 = x;
      do {
        if ((ppVar5->second)._M_string_length != 0) {
          local_1a8._0_8_ = &DAT_0000002f;
          local_1d0 = ppVar5;
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          local_1c8._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_1c8,(ulong)local_1a8);
          local_1c8.field_2._M_allocated_capacity = local_1a8._0_8_;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x1f) = '-';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x20) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x21) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x22) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x23) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x24) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x25) = '\"';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x26) = '>';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x27) = '%';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x28) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x29) = '<';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x2a) = '/';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x2b) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x2c) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x2d) = 'v';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x2e) = '>';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x10) = '<';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x11) = 'd';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x12) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x13) = 'v';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x14) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x15) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x16) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x17) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x18) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x19) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x1a) = '=';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x1b) = '\"';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x1c) = 's';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x1d) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x1e) = 'b';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0x1f) = '-';
          *(undefined4 *)local_1c8._M_dataplus._M_p = 0x20202020;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 4) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 5) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 6) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 7) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 8) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 9) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 10) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0xb) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0xc) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0xd) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0xe) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p + 0xf) = ' ';
          local_1c8._M_string_length = local_1a8._0_8_;
          local_1c8._M_dataplus._M_p[local_1a8._0_8_] = '\0';
          pcVar2 = (local_1d0->first)._M_dataplus._M_p;
          params = (pointer)local_1a8._0_8_;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,pcVar2 + (local_1d0->first)._M_string_length);
          StringUtil::Format<std::__cxx11::string>
                    (&local_220,(StringUtil *)&local_1c8,&local_70,&params->first);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     local_188._M_local_buf,&local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          paVar1 = &local_220.field_2;
          local_220.field_2._M_allocated_capacity._0_2_ = 10;
          local_220._M_string_length = 1;
          local_220._M_dataplus._M_p = (pointer)paVar1;
          StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_1a8,&local_1d0->second,&local_220);
          ppVar7 = (pointer)local_1a8._0_8_;
          ppVar5 = (pointer)local_1a8._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != paVar1) {
            operator_delete(local_220._M_dataplus._M_p);
            ppVar7 = (pointer)local_1a8._0_8_;
            ppVar5 = (pointer)local_1a8._8_8_;
          }
          for (; ppVar7 != ppVar5; ppVar7 = (pointer)&ppVar7->second) {
            local_140 = local_130;
            local_d0._0_8_ = (pointer)0x2b;
            local_140 = (pointer *)
                        ::std::__cxx11::string::_M_create((ulong *)&local_140,(ulong)local_d0);
            local_130[0] = (pointer)local_d0._0_8_;
            builtin_strncpy((char *)((long)local_140 + 0x1b),"\"value\">",8);
            builtin_strncpy((char *)((long)local_140 + 0x23),"%s</div>",8);
            local_140[2] = (pointer)0x616c63207669643c;
            local_140[3] = (pointer)0x756c6176223d7373;
            *(undefined4 *)local_140 = 0x20202020;
            builtin_strncpy((char *)((long)local_140 + 4),"    ",4);
            *(undefined4 *)(local_140 + 1) = 0x20202020;
            builtin_strncpy((char *)((long)local_140 + 0xc),"    ",4);
            local_138 = (pointer)local_d0._0_8_;
            *(char *)((long)local_140 + local_d0._0_8_) = '\0';
            local_b0._M_allocated_capacity = (size_type)local_a0;
            pcVar2 = (ppVar7->first)._M_dataplus._M_p;
            params = (pointer)local_d0._0_8_;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,pcVar2,pcVar2 + (ppVar7->first)._M_string_length);
            StringUtil::Format<std::__cxx11::string>
                      (&local_220,(StringUtil *)&local_140,(string *)&local_b0,&params->first);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_188._M_local_buf,&local_220);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar1) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            if ((char *)local_b0._M_allocated_capacity != local_a0) {
              operator_delete((void *)local_b0._M_allocated_capacity);
            }
            if (local_140 != local_130) {
              operator_delete(local_140);
            }
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1a8);
          ppVar5 = local_1d0;
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != local_f8);
      local_120 = local_110;
      local_118 = 0;
      local_110[0] = 0;
      x = local_170;
      uVar8 = local_168._M_allocated_capacity;
      if (local_188._M_allocated_capacity != local_188._8_8_) {
        local_1a8._0_8_ = (pointer)(local_1a8 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,local_200._M_dataplus._M_p,
                   (char *)(local_200._M_string_length + (long)local_200._M_dataplus._M_p));
        uVar8 = local_168._M_allocated_capacity;
        local_50.field_2._M_allocated_capacity._0_2_ = 10;
        local_50._M_string_length = 1;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        StringUtil::Join((string *)local_d0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)&local_188,&local_50);
        StringUtil::Format<std::__cxx11::string>
                  (&local_220,(StringUtil *)local_1a8,(string *)local_d0,&params->first);
        ::std::__cxx11::string::operator=((string *)&local_120,(string *)&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
          operator_delete((void *)local_d0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        x = local_170;
        if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_);
          x = local_170;
        }
      }
    }
    if ((((RenderTreeNode *)uVar8)->child_positions).
        super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        .
        super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (((RenderTreeNode *)uVar8)->child_positions).
        super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        .
        super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::append((char *)&local_120);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_188._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,local_168._8_8_,local_158->_M_local_buf + local_168._8_8_);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_f0,local_f0 + local_e8);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_120,local_120 + local_118);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&local_90,(StringUtil *)&local_200,&local_220,&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)y);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    root = local_100;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if (local_120 != local_110) {
      operator_delete(local_120);
    }
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)local_168._8_8_ != local_150) {
    operator_delete((void *)local_168._8_8_);
  }
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_90._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_allocated_capacity != &local_80) {
    operator_delete((void *)local_90._M_allocated_capacity);
  }
  local_220._M_dataplus._M_p = (pointer)RenderTree::GetNode(local_1d8,(idx_t)root,x);
  optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
            ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_220);
  if ((((vector<duckdb::RenderTreeNode::Coordinate,_true> *)(local_220._M_dataplus._M_p + 0x70))->
      super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
      ).
      super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
      ._M_impl.super__Vector_impl_data._M_start != *(pointer *)(local_220._M_dataplus._M_p + 0x78))
  {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid
              ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_220);
    pCVar9 = (((vector<duckdb::RenderTreeNode::Coordinate,_true> *)
              (local_220._M_dataplus._M_p + 0x70))->
             super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
             ).
             super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar3 = *(pointer *)(local_220._M_dataplus._M_p + 0x78);
    if (pCVar9 != pCVar3) {
      do {
        CreateTreeRecursive_abi_cxx11_
                  (&local_200,(duckdb *)local_1d8,(RenderTree *)pCVar9->x,pCVar9->y,y);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_200._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        pCVar9 = pCVar9 + 1;
      } while (pCVar9 != pCVar3);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  psVar6 = (string *)::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar6;
}

Assistant:

static string CreateTreeRecursive(RenderTree &root, idx_t x, idx_t y) {
	string result;

	result += "<li>";
	result += CreateGridItem(root, x, y);
	auto node = root.GetNode(x, y);
	if (!node->child_positions.empty()) {
		result += "<ul class=\"list-inline\">";
		for (auto &coord : node->child_positions) {
			result += CreateTreeRecursive(root, coord.x, coord.y);
		}
		result += "</ul>";
	}
	result += "</li>";
	return result;
}